

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  u16 *puVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  long lVar5;
  sqlite3 *db;
  Index *pIVar6;
  u8 uVar7;
  ushort uVar8;
  i16 iVar9;
  int iVar10;
  uint iDb;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Pgno PVar14;
  Table *pTVar15;
  Db *pDVar16;
  char *zLeft;
  Index *pIVar17;
  Index **ppIVar18;
  ulong uVar19;
  Table *pTVar20;
  Expr *pEVar21;
  CollSeq *pCVar22;
  void *pvVar23;
  Vdbe *p;
  u16 uVar24;
  Index **ppIVar25;
  Column *pCVar26;
  long lVar27;
  char *pcVar28;
  char *pcVar29;
  long in_FS_OFFSET;
  Token *local_118;
  ExprList_item *local_100;
  char *local_f0;
  Index *local_e8;
  undefined1 local_b8 [16];
  char *zExtra;
  Token *pName;
  DbFixer sFix;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  sFix.zType = &DAT_aaaaaaaaaaaaaaaa;
  sFix.pName = (Token *)&DAT_aaaaaaaaaaaaaaaa;
  sFix._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sFix.zDb = &DAT_aaaaaaaaaaaaaaaa;
  sFix.w.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
  sFix.pSchema = (Schema *)&DAT_aaaaaaaaaaaaaaaa;
  sFix.w.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
  sFix.w._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  sFix.w.xExprCallback = (_func_int_Walker_ptr_Expr_ptr *)&DAT_aaaaaaaaaaaaaaaa;
  sFix.w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
  sFix.pParse = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  sFix.w.pParse = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  db = pParse->db;
  pName = (Token *)0x0;
  zExtra = (char *)0x0;
  if ((pParse->nErr != 0) ||
     ((((idxType != '\x02' && (pParse->eParseMode == '\x01')) ||
       (iVar10 = sqlite3ReadSchema(pParse), iVar10 != 0)) ||
      (iVar10 = sqlite3HasExplicitNulls(pParse,pList), iVar10 != 0)))) {
LAB_0015e9c0:
    zLeft = (char *)0x0;
    goto LAB_0015e9c3;
  }
  if (pTblName != (SrcList *)0x0) {
    iDb = sqlite3TwoPartName(pParse,pName1,pName2,&pName);
    if ((int)iDb < 0) goto LAB_0015e9c0;
    if ((((db->init).busy == '\0') &&
        (pTVar15 = sqlite3SrcListLookup(pParse,pTblName), pTVar15 != (Table *)0x0 && pName2->n == 0)
        ) && (pTVar15->pSchema == db->aDb[1].pSchema)) {
      iDb = 1;
    }
    sFix.w.u.pNC = (NameContext *)&sFix;
    pDVar16 = pParse->db->aDb;
    sFix.zDb = pDVar16[iDb].zDbSName;
    sFix.pSchema = pDVar16[iDb].pSchema;
    sFix.zType = "index";
    local_118 = pName;
    sFix.pName = pName;
    sFix.bTemp = iDb == 1;
    sFix.w.xExprCallback = fixExprCb;
    sFix.w.xSelectCallback = fixSelectCb;
    sFix.w.xSelectCallback2 = sqlite3WalkWinDefnDummyCallback;
    sFix.w._32_8_ = sFix.w._32_8_ & 0xffff000000000000;
    sFix.pParse = pParse;
    sFix.w.pParse = pParse;
    sqlite3FixSrcList(sFix.w.u.pFix,pTblName);
    zLeft = (char *)0x0;
    pTVar15 = sqlite3LocateTableItem(pParse,0,pTblName->a);
    if (pTVar15 == (Table *)0x0) goto LAB_0015e9c3;
    if ((iDb != 1) || (db->aDb[1].pSchema == pTVar15->pSchema)) {
      if ((pTVar15->tabFlags & 0x80) == 0) goto LAB_0015eb88;
      local_e8 = sqlite3PrimaryKeyIndex(pTVar15);
      goto LAB_0015eba6;
    }
    zLeft = pTVar15->zName;
    pcVar28 = "cannot create a TEMP index on non-TEMP table \"%s\"";
    pcVar29 = (char *)0x0;
LAB_0015ec17:
    sqlite3ErrorMsg(pParse,pcVar28,zLeft);
    zLeft = pcVar29;
    goto LAB_0015ec34;
  }
  pTVar15 = pParse->pNewTable;
  if (pTVar15 == (Table *)0x0) goto LAB_0015e9c0;
  iDb = sqlite3SchemaToIndex(db,pTVar15->pSchema);
  local_118 = (Token *)0x0;
LAB_0015eb88:
  local_e8 = (Index *)0x0;
LAB_0015eba6:
  pDVar16 = db->aDb + (int)iDb;
  zLeft = pTVar15->zName;
  iVar10 = sqlite3_strnicmp(zLeft,"sqlite_",7);
  if (((iVar10 == 0) && (pTblName != (SrcList *)0x0)) && ((db->init).busy == '\0')) {
    pcVar28 = "table %s may not be indexed";
    pcVar29 = (char *)0x0;
    goto LAB_0015ec17;
  }
  if (pTVar15->eTabType == '\x01') {
    pcVar29 = "virtual tables may not be indexed";
LAB_0015ec27:
    zLeft = (char *)0x0;
    sqlite3ErrorMsg(pParse,pcVar29);
  }
  else {
    if (pTVar15->eTabType == '\x02') {
      pcVar29 = "views may not be indexed";
      goto LAB_0015ec27;
    }
    if (local_118 == (Token *)0x0) {
      uVar19 = 1;
      for (ppIVar18 = &pTVar15->pIndex; *ppIVar18 != (Index *)0x0; ppIVar18 = &(*ppIVar18)->pNext) {
        uVar19 = (ulong)((int)uVar19 + 1);
      }
      zLeft = sqlite3MPrintf(db,"sqlite_autoindex_%s_%d",zLeft,uVar19);
      if (zLeft == (char *)0x0) goto LAB_0015ed6c;
      if (pParse->eParseMode == '\0') {
LAB_0015ed78:
        pcVar29 = pDVar16->zDbSName;
        pcVar28 = "sqlite_master";
        if (iDb == 1) {
          pcVar28 = "sqlite_temp_master";
        }
        iVar10 = sqlite3AuthCheck(pParse,0x12,pcVar28,(char *)0x0,pcVar29);
        if ((iVar10 != 0) ||
           (iVar10 = sqlite3AuthCheck(pParse,(uint)(iDb == 1) * 2 + 1,zLeft,pTVar15->zName,pcVar29),
           iVar10 != 0)) goto LAB_0015ec34;
      }
      else {
        zLeft[7] = zLeft[7] + '\x01';
LAB_0015ed5d:
        if (pParse->eParseMode < 2) goto LAB_0015ed78;
      }
LAB_0015edd8:
      if (pList == (ExprList *)0x0) {
        local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pCVar26 = pTVar15->aCol;
        sVar3 = pTVar15->nCol;
        puVar1 = &pCVar26[(long)sVar3 + -1].colFlags;
        *puVar1 = *puVar1 | 8;
        local_b8._0_8_ = pCVar26[(long)sVar3 + -1].zCnName;
        uVar13 = sqlite3Strlen30((char *)local_b8._0_8_);
        local_b8._8_4_ = uVar13;
        pEVar21 = sqlite3ExprAlloc(db,0x3c,(Token *)local_b8,0);
        pList = sqlite3ExprListAppendNew(pParse->db,pEVar21);
        if (pList != (ExprList *)0x0) {
          iVar10 = 0;
          if (sortOrder != -1) {
            iVar10 = sortOrder;
          }
          pList->a[(long)pList->nExpr + -1].fg.sortFlags = (u8)iVar10;
          goto LAB_0015ee76;
        }
        pList = (ExprList *)0x0;
      }
      else {
        sqlite3ExprListCheckLength(pParse,pList,"index");
        if (pParse->nErr == 0) {
LAB_0015ee76:
          uVar13 = pList->nExpr;
          local_100 = pList->a;
          lVar27 = 0;
          uVar19 = 0;
          if (0 < (int)uVar13) {
            uVar19 = (ulong)uVar13;
          }
          iVar10 = 0;
          for (; uVar19 * 0x18 != lVar27; lVar27 = lVar27 + 0x18) {
            pcVar29 = *(char **)((long)&pList->a[0].pExpr + lVar27);
            if (*pcVar29 == 'r') {
              iVar11 = sqlite3Strlen30(*(char **)(pcVar29 + 8));
              iVar10 = iVar10 + iVar11 + 1;
            }
          }
          uVar12 = sqlite3Strlen30(zLeft);
          uVar24 = 1;
          if (local_e8 != (Index *)0x0) {
            uVar24 = local_e8->nKeyCol;
          }
          pIVar17 = sqlite3AllocateIndexObject
                              (db,uVar24 + (short)uVar13,uVar12 + iVar10 + 1,&zExtra);
          pcVar29 = zExtra;
          if (db->mallocFailed == '\0') {
            pIVar17->zName = zExtra;
            local_f0 = zExtra + (ulong)uVar12 + 1;
            zExtra = local_f0;
            memcpy(pcVar29,zLeft,(ulong)uVar12 + 1);
            pIVar17->pTable = pTVar15;
            pIVar17->onError = (u8)onError;
            *(ushort *)&pIVar17->field_0x63 =
                 (ushort)(idxType & 3) + (ushort)(onError != 0) * 8 |
                 *(ushort *)&pIVar17->field_0x63 & 0xfff4;
            pIVar17->pSchema = db->aDb[(int)iDb].pSchema;
            pIVar17->nKeyCol = (u16)pList->nExpr;
            if (pPIWhere != (Expr *)0x0) {
              sqlite3ResolveSelfReference(pParse,pTVar15,2,pPIWhere,(ExprList *)0x0);
              pIVar17->pPartIdxWhere = pPIWhere;
            }
            bVar2 = pDVar16->pSchema->file_format;
            if (1 < pParse->eParseMode) {
              pIVar17->aColExpr = pList;
              pList = (ExprList *)0x0;
            }
            pPIWhere = (Expr *)0x0;
            for (local_118 = (Token *)0x0; local_118 < (ulong)pIVar17->nKeyCol;
                local_118 = (Token *)((long)local_118 + 1)) {
              sqlite3StringToId(local_100->pExpr);
              sqlite3ResolveSelfReference(pParse,pTVar15,0x20,local_100->pExpr,(ExprList *)0x0);
              if (pParse->nErr != 0) goto LAB_0015f598;
              pEVar21 = sqlite3ExprSkipCollate(local_100->pExpr);
              if (pEVar21->op == 0xa8) {
                uVar13 = (uint)pEVar21->iColumn;
                if ((int)uVar13 < 0) {
                  uVar13 = (uint)pTVar15->iPKey;
                }
                else {
                  pCVar26 = pTVar15->aCol;
                  if ((pCVar26[uVar13].field_0x8 & 0xf) == 0) {
                    pIVar17->field_0x63 = pIVar17->field_0x63 & 0xf7;
                    pCVar26 = pTVar15->aCol;
                  }
                  if ((pCVar26[uVar13].colFlags & 0x20) != 0) {
                    pIVar17->field_0x64 = pIVar17->field_0x64 | 0x18;
                  }
                }
                pIVar17->aiColumn[(long)local_118] = (i16)uVar13;
              }
              else {
                if (pTVar15 == pParse->pNewTable) {
                  sqlite3ErrorMsg(pParse,
                                  "expressions prohibited in PRIMARY KEY and UNIQUE constraints");
                  goto LAB_0015f598;
                }
                if (pIVar17->aColExpr == (ExprList *)0x0) {
                  pIVar17->aColExpr = pList;
                  pList = (ExprList *)0x0;
                }
                pIVar17->aiColumn[(long)local_118] = -2;
                *(ushort *)&pIVar17->field_0x63 = *(ushort *)&pIVar17->field_0x63 & 0xeff7 | 0x1000;
                uVar13 = 0xfffffffe;
              }
              if (local_100->pExpr->op == 'r') {
                pcVar29 = (local_100->pExpr->u).zToken;
                uVar13 = sqlite3Strlen30(pcVar29);
                memcpy(local_f0,pcVar29,(ulong)uVar13 + 1);
                zExtra = local_f0 + (ulong)uVar13 + 1;
                pcVar29 = local_f0;
                local_f0 = zExtra;
              }
              else if ((int)uVar13 < 0) {
                pcVar29 = (char *)0x0;
              }
              else {
                pcVar29 = sqlite3ColumnColl(pTVar15->aCol + uVar13);
              }
              pcVar28 = "BINARY";
              if (pcVar29 != (char *)0x0) {
                pcVar28 = pcVar29;
              }
              if (((db->init).busy == '\0') &&
                 (pCVar22 = sqlite3LocateCollSeq(pParse,pcVar28), pCVar22 == (CollSeq *)0x0))
              goto LAB_0015f59d;
              uVar7 = '\0';
              pIVar17->azColl[(long)local_118] = pcVar28;
              if (3 < bVar2) {
                uVar7 = (local_100->fg).sortFlags;
              }
              pIVar17->aSortOrder[(long)local_118] = uVar7;
              local_100 = local_100 + 1;
            }
            if (local_e8 == (Index *)0x0) {
              pIVar17->aiColumn[(long)local_118] = -1;
              pIVar17->azColl[(long)local_118] = "BINARY";
            }
            else {
              for (uVar19 = 0; uVar19 < local_e8->nKeyCol; uVar19 = uVar19 + 1) {
                iVar10 = isDupColumn(pIVar17,(uint)pIVar17->nKeyCol,local_e8,(int)uVar19);
                if (iVar10 == 0) {
                  iVar10 = (int)local_118;
                  pIVar17->aiColumn[iVar10] = local_e8->aiColumn[uVar19];
                  pIVar17->azColl[iVar10] = local_e8->azColl[uVar19];
                  pIVar17->aSortOrder[iVar10] = local_e8->aSortOrder[uVar19];
                  local_118 = (Token *)(ulong)(iVar10 + 1);
                }
                else {
                  pIVar17->nColumn = pIVar17->nColumn - 1;
                }
              }
            }
            sqlite3DefaultRowEst(pIVar17);
            if (pParse->pNewTable == (Table *)0x0) {
              estimateIndexWidth(pIVar17);
            }
            recomputeColumnsNotIndexed(pIVar17);
            if ((pTblName != (SrcList *)0x0) && ((int)pTVar15->nCol <= (int)(uint)pIVar17->nColumn))
            {
              uVar4 = *(ushort *)&pIVar17->field_0x63;
              *(ushort *)&pIVar17->field_0x63 = uVar4 | 0x20;
              uVar8 = pTVar15->nCol;
              uVar13 = 0;
              if ((short)uVar8 < 1) {
                uVar8 = 0;
              }
              for (; uVar8 != uVar13; uVar13 = uVar13 + 1) {
                if ((uVar13 != (int)pTVar15->iPKey) &&
                   (iVar9 = sqlite3TableColumnToIndex(pIVar17,(i16)uVar13), iVar9 < 0)) {
                  *(ushort *)&pIVar17->field_0x63 = uVar4 & 0xffdf;
                  break;
                }
              }
            }
            if (pTVar15 == pParse->pNewTable) {
              ppIVar18 = &pTVar15->pIndex;
              while (pIVar6 = *ppIVar18, pIVar6 != (Index *)0x0) {
                uVar4 = pIVar6->nKeyCol;
                if (uVar4 == pIVar17->nKeyCol) {
                  uVar19 = 0;
                  do {
                    if (uVar4 == uVar19) {
                      uVar7 = pIVar6->onError;
                      if (uVar7 != pIVar17->onError) {
                        if ((uVar7 != '\v') && (pIVar17->onError != '\v')) {
                          sqlite3ErrorMsg(pParse,"conflicting ON CONFLICT clauses specified",0);
                          uVar7 = pIVar6->onError;
                        }
                        if (uVar7 == '\v') {
                          pIVar6->onError = pIVar17->onError;
                        }
                      }
                      if (idxType == '\x02') {
                        *(ushort *)&pIVar6->field_0x63 = *(ushort *)&pIVar6->field_0x63 & 0xfffc | 2
                        ;
                      }
                      if (pParse->eParseMode < 2) goto LAB_0015f598;
                      pIVar17->pNext = pParse->pNewIndex;
                      pParse->pNewIndex = pIVar17;
                      goto LAB_0015f544;
                    }
                    if (pIVar6->aiColumn[uVar19] != pIVar17->aiColumn[uVar19]) break;
                    iVar10 = sqlite3StrICmp(pIVar6->azColl[uVar19],pIVar17->azColl[uVar19]);
                    uVar19 = uVar19 + 1;
                  } while (iVar10 == 0);
                }
                ppIVar18 = &pIVar6->pNext;
              }
            }
            if (1 < pParse->eParseMode) goto LAB_0015f3d2;
            if ((db->init).busy == '\0') {
              if ((pTblName == (SrcList *)0x0) && ((pTVar15->tabFlags & 0x80) != 0)) {
LAB_0015f3d2:
                if ((pTblName == (SrcList *)0x0) || ((db->init).busy != '\0')) {
                  pIVar17->pNext = pTVar15->pIndex;
                  pTVar15->pIndex = pIVar17;
                  pPIWhere = (Expr *)0x0;
                }
                else {
                  if (pParse->eParseMode < 2) goto LAB_0015f68e;
                  pParse->pNewIndex = pIVar17;
LAB_0015f544:
                  pPIWhere = (Expr *)0x0;
                }
                goto LAB_0015ec34;
              }
              iVar10 = pParse->nMem + 1;
              pParse->nMem = iVar10;
              p = sqlite3GetVdbe(pParse);
              if (p != (Vdbe *)0x0) {
                sqlite3BeginWriteOperation(pParse,1,iDb);
                PVar14 = sqlite3VdbeAddOp0(p,0xbb);
                pIVar17->tnum = PVar14;
                sqlite3VdbeAddOp3(p,0x93,iDb,iVar10,2);
                if (pStart == (Token *)0x0) {
                  pcVar29 = (char *)0x0;
                }
                else {
                  iVar11 = (*(int *)&(pParse->sLastToken).z - (int)pName->z) +
                           (pParse->sLastToken).n;
                  pcVar29 = " UNIQUE";
                  if (onError == 0) {
                    pcVar29 = "";
                  }
                  pcVar29 = sqlite3MPrintf(db,"CREATE%s INDEX %.*s",pcVar29,
                                           (ulong)(iVar11 - (uint)(pName->z[(long)iVar11 + -1] ==
                                                                  ';')));
                }
                sqlite3NestedParse(pParse,
                                   "INSERT INTO %Q.sqlite_master VALUES(\'index\',%Q,%Q,#%d,%Q);",
                                   db->aDb[(int)iDb].zDbSName,pIVar17->zName,pTVar15->zName,iVar10,
                                   pcVar29);
                sqlite3DbFree(db,pcVar29);
                if (pTblName != (SrcList *)0x0) {
                  sqlite3RefillIndex(pParse,pIVar17,iVar10);
                  sqlite3ChangeCookie(pParse,iDb);
                  pcVar29 = sqlite3MPrintf(db,"name=\'%q\' AND type=\'index\'",pIVar17->zName);
                  sqlite3VdbeAddParseSchemaOp(p,iDb,pcVar29,0);
                  sqlite3VdbeAddOp2(p,0xa6,0,1);
                }
                sqlite3VdbeJumpHere(p,pIVar17->tnum);
                goto LAB_0015f3d2;
              }
LAB_0015f68e:
              pPIWhere = (Expr *)0x0;
              goto LAB_0015ef24;
            }
            if (pTblName == (SrcList *)0x0) {
LAB_0015f56a:
              pvVar23 = sqlite3HashInsert(&pIVar17->pSchema->idxHash,pIVar17->zName,pIVar17);
              if (pvVar23 == (void *)0x0) {
                *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
                goto LAB_0015f3d2;
              }
              sqlite3OomFault(db);
            }
            else {
              pIVar17->tnum = (db->init).newTnum;
              iVar10 = sqlite3IndexHasDuplicateRootPage(pIVar17);
              if (iVar10 == 0) goto LAB_0015f56a;
              sqlite3ErrorMsg(pParse,"invalid rootpage");
              iVar10 = sqlite3CorruptError(0x1ee1f);
              pParse->rc = iVar10;
            }
LAB_0015f598:
            pPIWhere = (Expr *)0x0;
          }
          else {
LAB_0015ef24:
            if (pIVar17 == (Index *)0x0) goto LAB_0015ec34;
          }
LAB_0015f59d:
          sqlite3FreeIndex(db,pIVar17);
        }
      }
    }
    else {
      zLeft = sqlite3NameFromToken(db,local_118);
      if (zLeft != (char *)0x0) {
        iVar10 = sqlite3CheckObjectName(pParse,zLeft,"index",pTVar15->zName);
        if (iVar10 == 0) {
          if (1 < pParse->eParseMode) goto LAB_0015edd8;
          pcVar29 = zLeft;
          if (((db->init).busy == '\0') &&
             (pTVar20 = sqlite3FindTable(db,zLeft,pDVar16->zDbSName), pTVar20 != (Table *)0x0)) {
            pcVar28 = "there is already a table named %s";
          }
          else {
            pIVar17 = sqlite3FindIndex(db,zLeft,pDVar16->zDbSName);
            if (pIVar17 == (Index *)0x0) goto LAB_0015ed5d;
            if (ifNotExist != 0) {
              sqlite3CodeVerifySchema(pParse,iDb);
              sqlite3ForceNotReadOnly(pParse);
              goto LAB_0015ec34;
            }
            pcVar28 = "index %s already exists";
          }
          goto LAB_0015ec17;
        }
        goto LAB_0015ec34;
      }
LAB_0015ed6c:
      zLeft = (char *)0x0;
    }
  }
LAB_0015ec34:
  ppIVar18 = &pTVar15->pIndex;
  do {
    ppIVar25 = ppIVar18;
    pIVar17 = *ppIVar25;
    if (pIVar17 == (Index *)0x0) goto LAB_0015e9c3;
    ppIVar18 = &pIVar17->pNext;
  } while (pIVar17->onError != '\x05');
  while ((pIVar6 = pIVar17->pNext, pIVar6 != (Index *)0x0 && (pIVar6->onError != '\x05'))) {
    *ppIVar25 = pIVar6;
    ppIVar25 = &pIVar6->pNext;
    pIVar17->pNext = pIVar6->pNext;
    pIVar6->pNext = pIVar17;
  }
LAB_0015e9c3:
  sqlite3ExprDelete(db,pPIWhere);
  sqlite3ExprListDelete(db,pList);
  sqlite3SrcListDelete(db,pTblName);
  sqlite3DbFree(db,zLeft);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto exit_create_index;
  }
  assert( db->mallocFailed==0 );
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }
  if( sqlite3HasExplicitNulls(pParse, pList) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initializing a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse,
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0
       && db->init.busy==0
       && pTblName!=0
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_schema table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName,"index",pTab->zName) ){
      goto exit_create_index;
    }
    if( !IN_RENAME_OBJECT ){
      if( !db->init.busy ){
        if( sqlite3FindTable(db, zName, pDb->zDbSName)!=0 ){
          sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
          goto exit_create_index;
        }
      }
      if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
        if( !ifNotExist ){
          sqlite3ErrorMsg(pParse, "index %s already exists", zName);
        }else{
          assert( !db->init.busy );
          sqlite3CodeVerifySchema(pParse, iDb);
          sqlite3ForceNotReadOnly(pParse);
        }
        goto exit_create_index;
      }
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_SPECIAL_PARSE ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    Column *pCol = &pTab->aCol[pTab->nCol-1];
    pCol->colFlags |= COLFLAG_UNIQUE;
    sqlite3TokenInit(&prevCol, pCol->zCnName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder, SQLITE_SO_UNDEFINED);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
    if( pParse->nErr ) goto exit_create_index;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /*
  ** Allocate the index structure.
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  assert( pList->nExpr + nExtraCol <= 32767 /* Fits in i16 */ );
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  pListItem = pList->a;
  if( IN_RENAME_OBJECT ){
    pIndex->aColExpr = pList;
    pList = 0;
  }
  for(i=0; i<pIndex->nKeyCol; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        pIndex->aColExpr = pList;
        pList = 0;
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
      pIndex->bHasExpr = 1;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else{
        if( pTab->aCol[j].notNull==0 ){
          pIndex->uniqNotNull = 0;
        }
        if( pTab->aCol[j].colFlags & COLFLAG_VIRTUAL ){
          pIndex->bHasVCol = 1;
          pIndex->bHasExpr = 1;
        }
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      assert( !ExprHasProperty(pListItem->pExpr, EP_IntValue) );
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = sqlite3ColumnColl(&pTab->aCol[j]);
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->fg.sortFlags & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( isDupColumn(pIndex, pIndex->nKeyCol, pPk, j) ){
        pIndex->nColumn--;
      }else{
        testcase( hasColumn(pIndex->aiColumn,pIndex->nKeyCol,x) );
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab)
      || pTab->iPKey<0 || sqlite3TableColumnToIndex(pIndex, pTab->iPKey)>=0 );
  recomputeColumnsNotIndexed(pIndex);
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3TableColumnToIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse,
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        if( IN_RENAME_OBJECT ){
          pIndex->pNext = pParse->pNewIndex;
          pParse->pNewIndex = pIndex;
          pIndex = 0;
        }
        goto exit_create_index;
      }
    }
  }

  if( !IN_RENAME_OBJECT ){

    /* Link the new Index structure to its table and to the other
    ** in-memory database structures.
    */
    assert( pParse->nErr==0 );
    if( db->init.busy ){
      Index *p;
      assert( !IN_SPECIAL_PARSE );
      assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      if( pTblName!=0 ){
        pIndex->tnum = db->init.newTnum;
        if( sqlite3IndexHasDuplicateRootPage(pIndex) ){
          sqlite3ErrorMsg(pParse, "invalid rootpage");
          pParse->rc = SQLITE_CORRUPT_BKPT;
          goto exit_create_index;
        }
      }
      p = sqlite3HashInsert(&pIndex->pSchema->idxHash,
          pIndex->zName, pIndex);
      if( p ){
        assert( p==pIndex );  /* Malloc must have failed */
        sqlite3OomFault(db);
        goto exit_create_index;
      }
      db->mDbFlags |= DBFLAG_SchemaChange;
    }

    /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
    ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
    ** emit code to allocate the index rootpage on disk and make an entry for
    ** the index in the sqlite_schema table and populate the index with
    ** content.  But, do not do this if we are simply reading the sqlite_schema
    ** table to parse the schema, or if this index is the PRIMARY KEY index
    ** of a WITHOUT ROWID table.
    **
    ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
    ** or UNIQUE index in a CREATE TABLE statement.  Since the table
    ** has just been created, it contains no data and the index initialization
    ** step can be skipped.
    */
    else if( HasRowid(pTab) || pTblName!=0 ){
      Vdbe *v;
      char *zStmt;
      int iMem = ++pParse->nMem;

      v = sqlite3GetVdbe(pParse);
      if( v==0 ) goto exit_create_index;

      sqlite3BeginWriteOperation(pParse, 1, iDb);

      /* Create the rootpage for the index using CreateIndex. But before
      ** doing so, code a Noop instruction and store its address in
      ** Index.tnum. This is required in case this index is actually a
      ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In
      ** that case the convertToWithoutRowidTable() routine will replace
      ** the Noop with a Goto to jump over the VDBE code generated below. */
      pIndex->tnum = (Pgno)sqlite3VdbeAddOp0(v, OP_Noop);
      sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, iMem, BTREE_BLOBKEY);

      /* Gather the complete text of the CREATE INDEX statement into
      ** the zStmt variable
      */
      assert( pName!=0 || pStart==0 );
      if( pStart ){
        int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
        if( pName->z[n-1]==';' ) n--;
        /* A named index with an explicit CREATE INDEX statement */
        zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
            onError==OE_None ? "" : " UNIQUE", n, pName->z);
      }else{
        /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
        /* zStmt = sqlite3MPrintf(""); */
        zStmt = 0;
      }

      /* Add an entry in sqlite_schema for this index
      */
      sqlite3NestedParse(pParse,
         "INSERT INTO %Q." LEGACY_SCHEMA_TABLE " VALUES('index',%Q,%Q,#%d,%Q);",
         db->aDb[iDb].zDbSName,
         pIndex->zName,
         pTab->zName,
         iMem,
         zStmt
      );
      sqlite3DbFree(db, zStmt);

      /* Fill the index with data and reparse the schema. Code an OP_Expire
      ** to invalidate all pre-compiled statements.
      */
      if( pTblName ){
        sqlite3RefillIndex(pParse, pIndex, iMem);
        sqlite3ChangeCookie(pParse, iDb);
        sqlite3VdbeAddParseSchemaOp(v, iDb,
            sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName), 0);
        sqlite3VdbeAddOp2(v, OP_Expire, 0, 1);
      }

      sqlite3VdbeJumpHere(v, (int)pIndex->tnum);
    }
  }
  if( db->init.busy || pTblName==0 ){
    pIndex->pNext = pTab->pIndex;
    pTab->pIndex = pIndex;
    pIndex = 0;
  }
  else if( IN_RENAME_OBJECT ){
    assert( pParse->pNewIndex==0 );
    pParse->pNewIndex = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) sqlite3FreeIndex(db, pIndex);
  if( pTab ){
    /* Ensure all REPLACE indexes on pTab are at the end of the pIndex list.
    ** The list was already ordered when this routine was entered, so at this
    ** point at most a single index (the newly added index) will be out of
    ** order.  So we have to reorder at most one index. */
    Index **ppFrom;
    Index *pThis;
    for(ppFrom=&pTab->pIndex; (pThis = *ppFrom)!=0; ppFrom=&pThis->pNext){
      Index *pNext;
      if( pThis->onError!=OE_Replace ) continue;
      while( (pNext = pThis->pNext)!=0 && pNext->onError!=OE_Replace ){
        *ppFrom = pNext;
        pThis->pNext = pNext->pNext;
        pNext->pNext = pThis;
        ppFrom = &pNext->pNext;
      }
      break;
    }
#ifdef SQLITE_DEBUG
    /* Verify that all REPLACE indexes really are now at the end
    ** of the index list.  In other words, no other index type ever
    ** comes after a REPLACE index on the list. */
    for(pThis = pTab->pIndex; pThis; pThis=pThis->pNext){
      assert( pThis->onError!=OE_Replace
           || pThis->pNext==0
           || pThis->pNext->onError==OE_Replace );
    }
#endif
  }
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}